

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

int duckdb_zstd::ZSTD_seqToCodes(seqStore_t *seqStorePtr)

{
  ushort uVar1;
  seqDef *psVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  int iVar6;
  BYTE BVar7;
  ulong uVar8;
  ulong uVar9;
  
  psVar2 = seqStorePtr->sequencesStart;
  pBVar3 = seqStorePtr->llCode;
  pBVar4 = seqStorePtr->mlCode;
  uVar8 = (ulong)((long)seqStorePtr->sequences - (long)psVar2) >> 3;
  if ((int)uVar8 != 0) {
    pBVar5 = seqStorePtr->ofCode;
    uVar9 = 0;
    do {
      uVar1 = psVar2[uVar9].litLength;
      if (uVar1 < 0x40) {
        BVar7 = ZSTD_LLcode(unsigned_int)::LL_Code[(uint)uVar1];
      }
      else {
        iVar6 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        BVar7 = '2' - ((byte)iVar6 ^ 0x1f);
      }
      iVar6 = 0x1f;
      if (psVar2[uVar9].offBase != 0) {
        for (; psVar2[uVar9].offBase >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      uVar1 = psVar2[uVar9].mlBase;
      pBVar3[uVar9] = BVar7;
      pBVar5[uVar9] = (BYTE)iVar6;
      if (uVar1 < 0x80) {
        BVar7 = ZSTD_MLcode(unsigned_int)::ML_Code[(uint)uVar1];
      }
      else {
        iVar6 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        BVar7 = 'C' - ((byte)iVar6 ^ 0x1f);
      }
      pBVar4[uVar9] = BVar7;
      uVar9 = uVar9 + 1;
    } while ((uVar8 & 0xffffffff) != uVar9);
  }
  if (seqStorePtr->longLengthType == ZSTD_llt_literalLength) {
    pBVar3[seqStorePtr->longLengthPos] = '#';
  }
  if (seqStorePtr->longLengthType == ZSTD_llt_matchLength) {
    pBVar4[seqStorePtr->longLengthPos] = '4';
  }
  return 0;
}

Assistant:

int ZSTD_seqToCodes(const seqStore_t* seqStorePtr)
{
    const seqDef* const sequences = seqStorePtr->sequencesStart;
    BYTE* const llCodeTable = seqStorePtr->llCode;
    BYTE* const ofCodeTable = seqStorePtr->ofCode;
    BYTE* const mlCodeTable = seqStorePtr->mlCode;
    U32 const nbSeq = (U32)(seqStorePtr->sequences - seqStorePtr->sequencesStart);
    U32 u;
    int longOffsets = 0;
    assert(nbSeq <= seqStorePtr->maxNbSeq);
    for (u=0; u<nbSeq; u++) {
        U32 const llv = sequences[u].litLength;
        U32 const ofCode = ZSTD_highbit32(sequences[u].offBase);
        U32 const mlv = sequences[u].mlBase;
        llCodeTable[u] = (BYTE)ZSTD_LLcode(llv);
        ofCodeTable[u] = (BYTE)ofCode;
        mlCodeTable[u] = (BYTE)ZSTD_MLcode(mlv);
        assert(!(MEM_64bits() && ofCode >= STREAM_ACCUMULATOR_MIN));
        if (MEM_32bits() && ofCode >= STREAM_ACCUMULATOR_MIN)
            longOffsets = 1;
    }
    if (seqStorePtr->longLengthType==ZSTD_llt_literalLength)
        llCodeTable[seqStorePtr->longLengthPos] = MaxLL;
    if (seqStorePtr->longLengthType==ZSTD_llt_matchLength)
        mlCodeTable[seqStorePtr->longLengthPos] = MaxML;
    return longOffsets;
}